

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

curl_ws_frame * curl_ws_meta(Curl_easy *data)

{
  tftp_state_data *ptVar1;
  _Bool _Var2;
  curl_ws_frame *pcVar3;
  
  if (data != (Curl_easy *)0x0) {
    if ((((data->magic == 0xc0dedbad) && (_Var2 = Curl_is_in_callback(data), _Var2)) &&
        (data->conn != (connectdata *)0x0)) &&
       (ptVar1 = (data->conn->proto).tftpc, ptVar1 != (tftp_state_data *)0x0)) {
      pcVar3 = (curl_ws_frame *)0x0;
      if (((data->set).field_0x8d0 & 0x20) == 0) {
        pcVar3 = (curl_ws_frame *)((long)&(ptVar1->remote_addr).buffer + 0x28);
      }
    }
    else {
      pcVar3 = (curl_ws_frame *)0x0;
    }
    return pcVar3;
  }
  return (curl_ws_frame *)0x0;
}

Assistant:

curl_ws_frame *curl_ws_meta(struct Curl_easy *data)
{
  /* we only return something for websocket, called from within the callback
     when not using raw mode */
  if(GOOD_EASY_HANDLE(data) && Curl_is_in_callback(data) && data->conn &&
     data->conn->proto.ws && !data->set.ws_raw_mode)
    return &data->conn->proto.ws->frame;
  return NULL;
}